

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tty.c
# Opt level: O0

int run_test_tty_pty(void)

{
  int iVar1;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_tty_t slave_tty;
  uv_tty_t master_tty;
  uv_loop_t loop;
  winsize w;
  int r;
  int slave_fd;
  int master_fd;
  
  iVar1 = uv_loop_init(&master_tty.orig_termios.c_ospeed);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
            ,0x1a4,"uv_loop_init(&loop)","==","0",(long)iVar1,"==",0);
    abort();
  }
  w._0_4_ = openpty(&r,&w.ws_xpixel,0,0,&loop.inotify_fd);
  if (w._0_4_ == 0) {
    iVar1 = uv_tty_init(&master_tty.orig_termios.c_ospeed,&eval_a,w._4_4_,0);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,0x1aa,"uv_tty_init(&loop, &slave_tty, slave_fd, 0)","==","0",(long)iVar1,"==",0);
      abort();
    }
    iVar1 = uv_tty_init(&master_tty.orig_termios.c_ospeed,&slave_tty.orig_termios.c_ospeed,r,0);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,0x1ab,"uv_tty_init(&loop, &master_tty, master_fd, 0)","==","0",(long)iVar1,"==",0);
      abort();
    }
    iVar1 = uv_is_readable(&eval_a);
    if (iVar1 == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,0x1ac,"uv_is_readable((uv_stream_t*) &slave_tty)");
      abort();
    }
    iVar1 = uv_is_writable(&eval_a);
    if (iVar1 == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,0x1ad,"uv_is_writable((uv_stream_t*) &slave_tty)");
      abort();
    }
    iVar1 = uv_is_readable(&slave_tty.orig_termios.c_ospeed);
    if (iVar1 == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,0x1ae,"uv_is_readable((uv_stream_t*) &master_tty)");
      abort();
    }
    iVar1 = uv_is_writable(&slave_tty.orig_termios.c_ospeed);
    if (iVar1 == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,0x1af,"uv_is_writable((uv_stream_t*) &master_tty)");
      abort();
    }
    if ((ulong)((uint)slave_tty.next_closing & 0x100000) != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,0x1b3,"(slave_tty.flags & 0x100000)","==","0",
              (ulong)((uint)slave_tty.next_closing & 0x100000),"==",0);
      abort();
    }
    if (((uint)master_tty.next_closing & 0x100000) == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,0x1b6,"master_tty.flags & 0x100000");
      abort();
    }
    iVar1 = close(w._4_4_);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,0x1b7,"close(slave_fd)","==","0",(long)iVar1,"==",0);
      abort();
    }
    uv_close(&eval_a,0);
    iVar1 = close(r);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,0x1b9,"close(master_fd)","==","0",(long)iVar1,"==",0);
      abort();
    }
    uv_close(&slave_tty.orig_termios.c_ospeed,0);
    iVar1 = uv_run(&master_tty.orig_termios.c_ospeed,0);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,0x1bc,"uv_run(&loop, UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
      abort();
    }
    close_loop((uv_loop_t *)&master_tty.orig_termios.c_ospeed);
    iVar1 = uv_loop_close(&master_tty.orig_termios.c_ospeed);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
              ,0x1be,"0","==","uv_loop_close(&loop)",0,"==",(long)iVar1);
      abort();
    }
    uv_library_shutdown();
    slave_fd = 0;
  }
  else {
    fprintf(_stderr,"%s\n","No pty available, skipping.");
    fflush(_stderr);
    slave_fd = 7;
  }
  return slave_fd;
}

Assistant:

TEST_IMPL(tty_pty) {
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif
#if defined(__ASAN__)
  RETURN_SKIP("Test does not currently work in ASAN");
#endif

#if defined(__APPLE__)                            || \
    defined(__DragonFly__)                        || \
    defined(__FreeBSD__)                          || \
    (defined(__linux__) && !defined(__ANDROID__)) || \
    defined(__NetBSD__)                           || \
    defined(__OpenBSD__)
  int master_fd, slave_fd, r;
  struct winsize w;
  uv_loop_t loop;
  uv_tty_t master_tty, slave_tty;

  ASSERT_OK(uv_loop_init(&loop));

  r = openpty(&master_fd, &slave_fd, NULL, NULL, &w);
  if (r != 0)
    RETURN_SKIP("No pty available, skipping.");

  ASSERT_OK(uv_tty_init(&loop, &slave_tty, slave_fd, 0));
  ASSERT_OK(uv_tty_init(&loop, &master_tty, master_fd, 0));
  ASSERT(uv_is_readable((uv_stream_t*) &slave_tty));
  ASSERT(uv_is_writable((uv_stream_t*) &slave_tty));
  ASSERT(uv_is_readable((uv_stream_t*) &master_tty));
  ASSERT(uv_is_writable((uv_stream_t*) &master_tty));
  /* Check if the file descriptor was reopened. If it is,
   * UV_HANDLE_BLOCKING_WRITES (value 0x100000) isn't set on flags.
   */
  ASSERT_OK((slave_tty.flags & 0x100000));
  /* The master_fd of a pty should never be reopened.
   */
  ASSERT(master_tty.flags & 0x100000);
  ASSERT_OK(close(slave_fd));
  uv_close((uv_handle_t*) &slave_tty, NULL);
  ASSERT_OK(close(master_fd));
  uv_close((uv_handle_t*) &master_tty, NULL);

  ASSERT_OK(uv_run(&loop, UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY(&loop);
#endif
  return 0;
}